

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::RgbaInputFile::FromYca::readYCAScanLine(FromYca *this,int y,Rgba *buf)

{
  uint scanLine;
  int i;
  long lVar1;
  long lVar2;
  
  scanLine = this->_yMax - 1;
  if (y <= this->_yMax) {
    scanLine = y;
  }
  if (y < this->_yMin) {
    scanLine = this->_yMin;
  }
  InputPart::readPixels(this->_inputPart,scanLine);
  if (this->_readC == false) {
    lVar2 = 0x68;
    for (lVar1 = 0; lVar1 < this->_width; lVar1 = lVar1 + 1) {
      Imath_3_2::half::operator=((half *)((long)&(this->_tmpBuf->r)._h + lVar2),0.0);
      Imath_3_2::half::operator=((half *)((long)&(this->_tmpBuf->b)._h + lVar2),0.0);
      lVar2 = lVar2 + 8;
    }
  }
  if ((scanLine & 1) == 0) {
    padTmpBuf(this);
    RgbaYca::reconstructChromaHoriz(this->_width,this->_tmpBuf,buf);
    return;
  }
  memcpy(buf,this->_tmpBuf + 0xd,(long)this->_width << 3);
  return;
}

Assistant:

void
RgbaInputFile::FromYca::readYCAScanLine (int y, Rgba* buf)
{
    //
    // Clamp y.
    //

    if (y < _yMin)
        y = _yMin;
    else if (y > _yMax)
        y = _yMax - 1;

    //
    // Read scan line y into _tmpBuf.
    //

    _inputPart.readPixels (y);

    //
    // Reconstruct missing chroma samples and copy
    // the scan line into buf.
    //

    if (!_readC)
    {
        for (int i = 0; i < _width; ++i)
        {
            _tmpBuf[i + N2].r = 0;
            _tmpBuf[i + N2].b = 0;
        }
    }

    if (y & 1) { memcpy (buf, _tmpBuf + N2, _width * sizeof (Rgba)); }
    else
    {
        padTmpBuf ();
        reconstructChromaHoriz (_width, _tmpBuf, buf);
    }
}